

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_decimalquantity.cpp
# Opt level: O3

void __thiscall
icu_63::number::impl::DecimalQuantity::readDoubleConversionToBcd
          (DecimalQuantity *this,char *buffer,int32_t length,int32_t point)

{
  char *pcVar1;
  long lVar2;
  ulong uVar3;
  int8_t *piVar4;
  
  if (length < 0x11) {
    if (length < 1) {
      piVar4 = (int8_t *)0x0;
    }
    else {
      pcVar1 = buffer + (uint)length;
      lVar2 = 0;
      piVar4 = (int8_t *)0x0;
      do {
        pcVar1 = pcVar1 + -1;
        piVar4 = (int8_t *)((ulong)piVar4 | (long)*pcVar1 + -0x30 << ((byte)lVar2 & 0x3f));
        lVar2 = lVar2 + 4;
      } while ((ulong)(uint)length << 2 != lVar2);
    }
    (this->fBCD).bcdBytes.ptr = piVar4;
  }
  else {
    ensureCapacity(this,length);
    pcVar1 = buffer + (uint)length;
    uVar3 = 0;
    do {
      pcVar1 = pcVar1 + -1;
      (this->fBCD).bcdBytes.ptr[uVar3] = *pcVar1 + -0x30;
      uVar3 = uVar3 + 1;
    } while ((uint)length != uVar3);
  }
  this->scale = point - length;
  this->precision = length;
  return;
}

Assistant:

void DecimalQuantity::readDoubleConversionToBcd(
        const char* buffer, int32_t length, int32_t point) {
    // NOTE: Despite the fact that double-conversion's API is called
    // "DoubleToAscii", they actually use '0' (as opposed to u8'0').
    if (length > 16) {
        ensureCapacity(length);
        for (int32_t i = 0; i < length; i++) {
            fBCD.bcdBytes.ptr[i] = buffer[length-i-1] - '0';
        }
    } else {
        uint64_t result = 0L;
        for (int32_t i = 0; i < length; i++) {
            result |= static_cast<uint64_t>(buffer[length-i-1] - '0') << (4 * i);
        }
        fBCD.bcdLong = result;
    }
    scale = point - length;
    precision = length;
}